

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combine_access_chains.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::CombineAccessChains::Has64BitIndices(CombineAccessChains *this,Instruction *inst)

{
  uint32_t uVar1;
  int iVar2;
  IRContext *pIVar3;
  DefUseManager *this_00;
  Instruction *this_01;
  TypeManager *this_02;
  Type *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Type *index_type;
  Instruction *index_inst;
  uint32_t i;
  Instruction *inst_local;
  CombineAccessChains *this_local;
  
  index_inst._4_4_ = 1;
  while( true ) {
    uVar1 = opt::Instruction::NumInOperands(inst);
    if (uVar1 <= index_inst._4_4_) {
      return false;
    }
    pIVar3 = Pass::context(&this->super_Pass);
    this_00 = IRContext::get_def_use_mgr(pIVar3);
    uVar1 = opt::Instruction::GetSingleWordInOperand(inst,index_inst._4_4_);
    this_01 = analysis::DefUseManager::GetDef(this_00,uVar1);
    pIVar3 = Pass::context(&this->super_Pass);
    this_02 = IRContext::get_type_mgr(pIVar3);
    uVar1 = opt::Instruction::type_id(this_01);
    pTVar4 = analysis::TypeManager::GetType(this_02,uVar1);
    iVar2 = (*pTVar4->_vptr_Type[10])();
    if (CONCAT44(extraout_var,iVar2) == 0) break;
    iVar2 = (*pTVar4->_vptr_Type[10])();
    uVar1 = analysis::Integer::width((Integer *)CONCAT44(extraout_var_00,iVar2));
    if (uVar1 != 0x20) {
      return true;
    }
    index_inst._4_4_ = index_inst._4_4_ + 1;
  }
  return true;
}

Assistant:

bool CombineAccessChains::Has64BitIndices(Instruction* inst) {
  for (uint32_t i = 1; i < inst->NumInOperands(); ++i) {
    Instruction* index_inst =
        context()->get_def_use_mgr()->GetDef(inst->GetSingleWordInOperand(i));
    const analysis::Type* index_type =
        context()->get_type_mgr()->GetType(index_inst->type_id());
    if (!index_type->AsInteger() || index_type->AsInteger()->width() != 32)
      return true;
  }
  return false;
}